

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O2

ostream * operator<<(ostream *out_stream,Date *date)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(out_stream,0x30);
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 4;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)out_stream,date->year);
  poVar1 = std::operator<<(poVar1,'-');
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 2;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)out_stream,date->month);
  poVar1 = std::operator<<(poVar1,'-');
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 2;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)out_stream,date->day);
  return poVar1;
}

Assistant:

ostream& operator<<(ostream& out_stream, const Date& date) {
    out_stream << setfill('0') << setw(4);
    out_stream << date.GetYear() << '-' << setw(2);
    out_stream << date.GetMonth() << '-' << setw(2);

    return out_stream << date.GetDay();
}